

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)> *
__thiscall
chaiscript::boxed_cast<std::function<std::__cxx11::string(int)>>
          (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
           *__return_storage_ptr__,chaiscript *this,Boxed_Value *bv,
          Type_Conversions_State *t_conversions)

{
  undefined8 *puVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  undefined8 *puVar5;
  undefined1 local_78 [32];
  pointer_____offset_0x10___ *local_58;
  pointer_____offset_0x10___ *local_50;
  undefined4 local_48;
  
  if (bv != (Boxed_Value *)0x0) {
    local_78._0_8_ = &std::function<std::__cxx11::string(int)>::typeinfo;
    local_78._8_8_ = &std::function<std::__cxx11::string(int)>::typeinfo;
    local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
    bVar4 = Type_Info::bare_equal(*(Type_Info **)this,(Type_Info *)local_78);
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::convertable_type<std::function<std::__cxx11::string(int)>>
                          ((Type_Conversions *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), bVar4)) {
      if ((bv != (Boxed_Value *)0x0) &&
         (bVar4 = Type_Conversions::convertable_type<std::function<std::__cxx11::string(int)>>
                            ((Type_Conversions *)
                             (bv->m_data).
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr), bVar4)) {
        local_58 = &std::function<std::__cxx11::string(int)>::typeinfo;
        local_50 = &std::function<std::__cxx11::string(int)>::typeinfo;
        local_48 = 0;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)local_78,
                   &((bv->m_data).
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_type_info,(Conversion_Saves *)&local_58,
                   (Boxed_Value *)
                   (bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        detail::
        Cast_Helper<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>_>
        ::cast(__return_storage_ptr__,(Boxed_Value *)local_78,(Type_Conversions_State *)bv);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return __return_storage_ptr__;
        }
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
        return __return_storage_ptr__;
      }
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x38);
      puVar1 = *(undefined8 **)this;
      local_78._16_8_ = puVar1[2];
      ptVar2 = (type_info *)*puVar1;
      ptVar3 = (type_info *)puVar1[1];
      *puVar5 = &PTR__bad_cast_005a4ab0;
      local_78._0_4_ = SUB84(ptVar2,0);
      local_78._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
      local_78._8_4_ = SUB84(ptVar3,0);
      local_78._12_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
      *(undefined4 *)(puVar5 + 1) = local_78._0_4_;
      *(undefined4 *)((long)puVar5 + 0xc) = local_78._4_4_;
      *(undefined4 *)(puVar5 + 2) = local_78._8_4_;
      *(undefined4 *)((long)puVar5 + 0x14) = local_78._12_4_;
      puVar5[3] = local_78._16_8_;
      puVar5[4] = &std::function<std::__cxx11::string(int)>::typeinfo;
      puVar5[5] = 0x19;
      puVar5[6] = "Cannot perform boxed_cast";
      local_78._0_8_ = ptVar2;
      local_78._8_8_ = ptVar3;
      __cxa_throw(puVar5,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  detail::
  Cast_Helper<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>_>
  ::cast(__return_storage_ptr__,(Boxed_Value *)this,(Type_Conversions_State *)bv);
  return __return_storage_ptr__;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }